

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O0

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::propagatePseudoobj
          (SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *lp)

{
  type_conflict5 tVar1;
  bool bVar2;
  ulong *puVar3;
  element_type *peVar4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar5;
  long *in_RSI;
  long in_RDI;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  newbound_1;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  newbound;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  objval;
  int j_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  val;
  int j;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  pseudoObj;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_6;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_6;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_3;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_3;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_5;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_5;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_7;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_7;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_4;
  SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff438;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff440;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff448;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffff450;
  self_type *in_stack_fffffffffffff458;
  undefined4 in_stack_fffffffffffff460;
  undefined4 in_stack_fffffffffffff464;
  undefined7 in_stack_fffffffffffff470;
  byte in_stack_fffffffffffff477;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff478;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff480;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff488;
  undefined1 *in_stack_fffffffffffff490;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff498;
  TightenBoundsPS *in_stack_fffffffffffff4a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff4a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff4b0;
  bool local_aaa;
  undefined1 local_a78 [72];
  undefined1 local_a30 [72];
  undefined1 local_9e8 [184];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_930;
  undefined1 local_8f8 [56];
  double local_8c0;
  undefined1 local_8b1;
  undefined1 local_8b0 [72];
  undefined1 local_868 [88];
  undefined1 local_810 [56];
  undefined1 local_7d8 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_7a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_768;
  undefined1 local_730 [56];
  undefined8 local_6f8;
  undefined8 local_6e0;
  undefined1 local_6d8 [56];
  undefined1 local_6a0 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_668;
  int local_630;
  byte local_629;
  undefined1 local_614 [56];
  undefined1 local_5dc [84];
  ulong local_588;
  undefined1 local_580 [56];
  undefined1 local_548 [56];
  undefined1 local_510 [56];
  ulong local_4d8;
  undefined1 local_4cc [56];
  undefined4 local_494;
  undefined1 local_490 [56];
  ulong local_458;
  undefined1 local_450 [56];
  undefined4 local_418;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_414;
  int local_3dc;
  undefined1 local_3d8 [56];
  long *local_3a0;
  undefined8 local_390;
  ulong *local_388;
  undefined1 *local_380;
  undefined8 local_378;
  ulong *local_370;
  undefined1 *local_368;
  undefined8 local_360;
  ulong *local_358;
  undefined1 *local_350;
  undefined8 local_348;
  undefined8 local_340;
  undefined1 *local_338;
  undefined8 local_330;
  undefined8 *local_328;
  undefined1 *local_320;
  long local_318;
  undefined1 *local_310;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_308;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_300;
  long local_2f8;
  undefined1 *local_2f0;
  long local_2e8;
  undefined1 *local_2e0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2d0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2a8;
  undefined1 *local_2a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_298;
  undefined1 *local_290;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_288;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_268;
  undefined1 *local_260;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_258;
  undefined1 *local_250;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_248;
  SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_240;
  undefined1 *local_238;
  long local_230;
  undefined8 *local_228;
  undefined8 local_220;
  ulong *local_218;
  ulong *local_210;
  ulong *local_208;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_1f9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1f0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1e0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1d0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1c8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_1b9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_198;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_190;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_188;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_179;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_178;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_158;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_150;
  undefined1 *local_148;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_139;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_138;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_118;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_110;
  undefined1 *local_108;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_f9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_b9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_98;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_90;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_88;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_79;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_50;
  undefined1 *local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  undefined1 *local_8;
  
  local_318 = in_RDI + 0x38;
  local_310 = local_3d8;
  local_3a0 = in_RSI;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff440,
             (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff438);
  local_3dc = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x41db15);
  while( true ) {
    do {
      while( true ) {
        local_3dc = local_3dc + -1;
        if (local_3dc < 0) {
          local_2f8 = in_RDI + 0x228;
          local_2f0 = local_548;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff440,
                     (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff438);
          puVar3 = (ulong *)infinity();
          local_588 = *puVar3 ^ 0x8000000000000000;
          local_350 = local_580;
          local_358 = &local_588;
          local_360 = 0;
          local_218 = local_358;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    (in_stack_fffffffffffff450,(double)in_stack_fffffffffffff448,
                     in_stack_fffffffffffff440);
          SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::tolerances(in_stack_fffffffffffff438);
          peVar4 = std::
                   __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x41dfe6);
          local_629 = 0;
          Tolerances::epsilon(peVar4);
          bVar2 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                            (in_stack_fffffffffffff480,in_stack_fffffffffffff478,
                             (double)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470));
          local_aaa = false;
          if (bVar2) {
            local_2e8 = in_RDI + 0x228;
            local_2e0 = local_5dc;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff440,
                       (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff438);
            local_340 = infinity();
            local_338 = local_614;
            local_348 = 0;
            local_220 = local_340;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                      (in_stack_fffffffffffff450,(double)in_stack_fffffffffffff448,
                       in_stack_fffffffffffff440);
            SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::tolerances(in_stack_fffffffffffff438);
            local_629 = 1;
            peVar4 = std::
                     __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x41e109);
            Tolerances::epsilon(peVar4);
            local_aaa = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                                  (in_stack_fffffffffffff480,in_stack_fffffffffffff478,
                                   (double)CONCAT17(in_stack_fffffffffffff477,
                                                    in_stack_fffffffffffff470));
          }
          if ((local_629 & 1) != 0) {
            std::shared_ptr<soplex::Tolerances>::~shared_ptr
                      ((shared_ptr<soplex::Tolerances> *)0x41e17a);
          }
          std::shared_ptr<soplex::Tolerances>::~shared_ptr
                    ((shared_ptr<soplex::Tolerances> *)0x41e187);
          if (local_aaa != false) {
            tVar1 = boost::multiprecision::operator>
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)in_stack_fffffffffffff438,
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)0x41e1b3);
            if (tVar1) {
              local_230 = in_RDI + 0x260;
              local_238 = local_3d8;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                        ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff440,
                         (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff438);
            }
            local_630 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)0x41e25d);
            while (local_630 = local_630 + -1, -1 < local_630) {
              local_2d8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ::maxObj(in_stack_fffffffffffff440,
                                   (int)((ulong)in_stack_fffffffffffff438 >> 0x20));
              local_2d0 = &local_668;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                        ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff440,
                         (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff438);
              local_2c0 = local_6a0;
              local_2c8 = &local_668;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                        ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff440,
                         (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff438);
              local_6e0 = 0;
              local_320 = local_6d8;
              local_328 = &local_6e0;
              local_330 = 0;
              local_228 = local_328;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                        (in_stack_fffffffffffff450,(double)in_stack_fffffffffffff448,
                         in_stack_fffffffffffff440);
              SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::tolerances(in_stack_fffffffffffff438);
              peVar4 = std::
                       __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x41e382);
              Tolerances::epsilon(peVar4);
              bVar2 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                                (in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8,
                                 (double)in_stack_fffffffffffff4a0);
              std::shared_ptr<soplex::Tolerances>::~shared_ptr
                        ((shared_ptr<soplex::Tolerances> *)0x41e3c9);
              if (!bVar2) {
                local_6f8 = 0;
                tVar1 = boost::multiprecision::operator<
                                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)in_stack_fffffffffffff438,(double *)0x41e422);
                if (tVar1) {
                  pnVar5 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ::lower(in_stack_fffffffffffff440,
                                   (int)((ulong)in_stack_fffffffffffff438 >> 0x20));
                  local_b0 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)(in_RDI + 0x228);
                  local_b8 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)(in_RDI + 0x260);
                  local_a8 = &local_7a0;
                  boost::multiprecision::detail::
                  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                  ::
                  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (&local_b9,local_b0,local_b8);
                  local_a0 = &local_7a0;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff440);
                  local_90 = local_b0;
                  local_98 = local_b8;
                  local_88 = &local_7a0;
                  boost::multiprecision::default_ops::
                  eval_subtract<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff440,
                             (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff438,
                             (cpp_dec_float<50U,_int,_void> *)0x41e511);
                  local_1b8 = &local_668;
                  local_1b0 = &local_7a0;
                  local_1a8 = &local_768;
                  boost::multiprecision::detail::
                  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                  ::
                  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (&local_1b9,&local_7a0,local_1b8);
                  local_1a0 = &local_768;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff440);
                  local_190 = local_1b0;
                  local_198 = local_1b8;
                  local_188 = &local_768;
                  boost::multiprecision::default_ops::
                  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff440,
                             (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff438,
                             (cpp_dec_float<50U,_int,_void> *)0x41e5d0);
                  local_38 = &local_768;
                  local_30 = pnVar5;
                  local_28 = local_730;
                  boost::multiprecision::detail::
                  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                  ::
                  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (&local_39,pnVar5,&local_768);
                  local_20 = local_730;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff440);
                  local_10 = local_30;
                  local_18 = local_38;
                  local_8 = local_730;
                  boost::multiprecision::default_ops::
                  eval_add<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff440,
                             (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff438,
                             (cpp_dec_float<50U,_int,_void> *)0x41e68f);
                  local_2b0 = local_7d8;
                  local_2b8 = local_730;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff440,
                             (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff438);
                  local_2a8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ::upper(in_stack_fffffffffffff440,
                                      (int)((ulong)in_stack_fffffffffffff438 >> 0x20));
                  local_2a0 = local_810;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff440,
                             (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff438);
                  SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::tolerances(in_stack_fffffffffffff438);
                  peVar4 = std::
                           __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)0x41e72f);
                  Tolerances::epsilon(peVar4);
                  bVar2 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                                    (in_stack_fffffffffffff480,in_stack_fffffffffffff478,
                                     (double)CONCAT17(in_stack_fffffffffffff477,
                                                      in_stack_fffffffffffff470));
                  std::shared_ptr<soplex::Tolerances>::~shared_ptr
                            ((shared_ptr<soplex::Tolerances> *)0x41e776);
                  if (bVar2) {
                    operator_new(0xa0);
                    local_8b1 = 1;
                    local_298 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ::upper(in_stack_fffffffffffff440,
                                        (int)((ulong)in_stack_fffffffffffff438 >> 0x20));
                    local_290 = local_868;
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                              ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff440,
                               (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff438);
                    local_288 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ::lower(in_stack_fffffffffffff440,
                                        (int)((ulong)in_stack_fffffffffffff438 >> 0x20));
                    in_stack_fffffffffffff4a8 =
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)(local_8b0 + 0x10);
                    local_280 = in_stack_fffffffffffff4a8;
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                              ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff440,
                               (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff438);
                    in_stack_fffffffffffff4b0 =
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)local_8b0;
                    std::shared_ptr<soplex::Tolerances>::shared_ptr
                              ((shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffff440,
                               (shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffff438);
                    TightenBoundsPS::TightenBoundsPS
                              (in_stack_fffffffffffff4a0,in_stack_fffffffffffff498,
                               (int)((ulong)in_stack_fffffffffffff490 >> 0x20),
                               in_stack_fffffffffffff488,in_stack_fffffffffffff480,
                               (shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffff478);
                    local_8b1 = cpp_dec_float_finite >> 0x18;
                    std::
                    shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep>
                    ::
                    shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::TightenBoundsPS,void>
                              ((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                                *)in_stack_fffffffffffff440,
                               (TightenBoundsPS *)in_stack_fffffffffffff438);
                    std::shared_ptr<soplex::Tolerances>::~shared_ptr
                              ((shared_ptr<soplex::Tolerances> *)0x41e8d7);
                    Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                    ::append((Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                              *)in_stack_fffffffffffff440,
                             (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                              *)in_stack_fffffffffffff438);
                    (**(code **)(*local_3a0 + 0x168))(local_3a0,local_630,local_730,0);
                    std::
                    shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                    ::~shared_ptr((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                                   *)0x41e929);
                  }
                }
                else {
                  local_8c0 = 0.0;
                  tVar1 = boost::multiprecision::operator>
                                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)in_stack_fffffffffffff438,(double *)0x41e9fa);
                  if (tVar1) {
                    in_stack_fffffffffffff480 =
                         SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ::upper(in_stack_fffffffffffff440,
                                 (int)((ulong)in_stack_fffffffffffff438 >> 0x20));
                    local_f0 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)(in_RDI + 0x228);
                    local_f8 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)(in_RDI + 0x260);
                    in_stack_fffffffffffff478 =
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)(local_9e8 + 0x80);
                    local_e8 = in_stack_fffffffffffff478;
                    boost::multiprecision::detail::
                    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                    ::
                    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              (&local_f9,local_f0,local_f8);
                    local_e0 = in_stack_fffffffffffff478;
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                              ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff440);
                    local_d0 = local_f0;
                    local_d8 = local_f8;
                    local_c8 = in_stack_fffffffffffff478;
                    boost::multiprecision::default_ops::
                    eval_subtract<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                              ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff440,
                               (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff438,
                               (cpp_dec_float<50U,_int,_void> *)0x41eadd);
                    in_stack_fffffffffffff488 = &local_930;
                    local_1f8 = &local_668;
                    local_1f0 = in_stack_fffffffffffff478;
                    local_1e8 = in_stack_fffffffffffff488;
                    boost::multiprecision::detail::
                    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                    ::
                    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              (&local_1f9,in_stack_fffffffffffff478,local_1f8);
                    local_1e0 = in_stack_fffffffffffff488;
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                              ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff440);
                    local_1d0 = local_1f0;
                    local_1d8 = local_1f8;
                    local_1c8 = in_stack_fffffffffffff488;
                    boost::multiprecision::default_ops::
                    eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                              ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff440,
                               (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff438,
                               (cpp_dec_float<50U,_int,_void> *)0x41eb90);
                    in_stack_fffffffffffff490 = local_8f8;
                    local_78 = in_stack_fffffffffffff488;
                    local_70 = in_stack_fffffffffffff480;
                    local_68 = in_stack_fffffffffffff490;
                    boost::multiprecision::detail::
                    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                    ::
                    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              (&local_79,in_stack_fffffffffffff480,in_stack_fffffffffffff488);
                    local_60 = in_stack_fffffffffffff490;
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                              ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff440);
                    local_50 = local_70;
                    local_58 = local_78;
                    local_48 = in_stack_fffffffffffff490;
                    boost::multiprecision::default_ops::
                    eval_add<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                              ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff440,
                               (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff438,
                               (cpp_dec_float<50U,_int,_void> *)0x41ec40);
                    local_270 = local_9e8 + 0x48;
                    local_278 = in_stack_fffffffffffff490;
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                              ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff440,
                               (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff438);
                    local_268 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ::lower(in_stack_fffffffffffff440,
                                        (int)((ulong)in_stack_fffffffffffff438 >> 0x20));
                    local_260 = local_9e8 + 0x10;
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                              ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff440,
                               (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff438);
                    in_stack_fffffffffffff498 =
                         (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)local_9e8;
                    SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::tolerances(in_stack_fffffffffffff438);
                    peVar4 = std::
                             __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)0x41ecd7);
                    in_stack_fffffffffffff4a0 = (TightenBoundsPS *)Tolerances::epsilon(peVar4);
                    in_stack_fffffffffffff477 =
                         GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                                   (in_stack_fffffffffffff480,in_stack_fffffffffffff478,
                                    (double)CONCAT17(in_stack_fffffffffffff477,
                                                     in_stack_fffffffffffff470));
                    std::shared_ptr<soplex::Tolerances>::~shared_ptr
                              ((shared_ptr<soplex::Tolerances> *)0x41ed15);
                    if ((in_stack_fffffffffffff477 & 1) != 0) {
                      in_stack_fffffffffffff450 =
                           (cpp_dec_float<50U,_int,_void> *)operator_new(0xa0);
                      local_258 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ::upper(in_stack_fffffffffffff440,
                                          (int)((ulong)in_stack_fffffffffffff438 >> 0x20));
                      local_250 = local_a30;
                      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                                ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff440,
                                 (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff438);
                      in_stack_fffffffffffff448 =
                           SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ::lower(in_stack_fffffffffffff440,
                                   (int)((ulong)in_stack_fffffffffffff438 >> 0x20));
                      in_stack_fffffffffffff438 =
                           (SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)(local_a78 + 0x10);
                      local_248 = in_stack_fffffffffffff448;
                      local_240 = in_stack_fffffffffffff438;
                      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                                ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff440,
                                 (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff438);
                      in_stack_fffffffffffff440 =
                           (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)local_a78;
                      std::shared_ptr<soplex::Tolerances>::shared_ptr
                                ((shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffff440,
                                 (shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffff438);
                      TightenBoundsPS::TightenBoundsPS
                                (in_stack_fffffffffffff4a0,in_stack_fffffffffffff498,
                                 (int)((ulong)in_stack_fffffffffffff490 >> 0x20),
                                 in_stack_fffffffffffff488,in_stack_fffffffffffff480,
                                 (shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffff478);
                      std::
                      shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep>
                      ::
                      shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::TightenBoundsPS,void>
                                ((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                                  *)in_stack_fffffffffffff440,
                                 (TightenBoundsPS *)in_stack_fffffffffffff438);
                      std::shared_ptr<soplex::Tolerances>::~shared_ptr
                                ((shared_ptr<soplex::Tolerances> *)0x41ee50);
                      Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                      ::append((Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                                *)in_stack_fffffffffffff440,
                               (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                                *)in_stack_fffffffffffff438);
                      (**(code **)(*local_3a0 + 0x150))(local_3a0,local_630,local_8f8,0);
                      std::
                      shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                      ::~shared_ptr((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                                     *)0x41eea2);
                    }
                  }
                }
              }
            }
          }
          return;
        }
        local_308 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::maxObj(in_stack_fffffffffffff440,
                             (int)((ulong)in_stack_fffffffffffff438 >> 0x20));
        local_300 = &local_414;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff440,
                   (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff438);
        local_418 = 0;
        tVar1 = boost::multiprecision::operator<
                          (in_stack_fffffffffffff448,(int *)in_stack_fffffffffffff440);
        if (!tVar1) break;
        SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::lower(in_stack_fffffffffffff440,(int)((ulong)in_stack_fffffffffffff438 >> 0x20));
        puVar3 = (ulong *)infinity();
        local_458 = *puVar3 ^ 0x8000000000000000;
        local_380 = local_450;
        local_388 = &local_458;
        local_390 = 0;
        local_208 = local_388;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (in_stack_fffffffffffff450,(double)in_stack_fffffffffffff448,
                   in_stack_fffffffffffff440);
        tVar1 = boost::multiprecision::operator<=
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_fffffffffffff438,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x41dc4a);
        if (tVar1) {
          return;
        }
        local_138 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::lower(in_stack_fffffffffffff440,
                            (int)((ulong)in_stack_fffffffffffff438 >> 0x20));
        local_128 = local_490;
        local_130 = &local_414;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_139,local_130,local_138);
        local_120 = local_490;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff440);
        local_108 = local_490;
        local_110 = local_130;
        local_118 = local_138;
        boost::multiprecision::default_ops::
        eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff440,
                   (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff438,
                   (cpp_dec_float<50U,_int,_void> *)0x41dd18);
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
        ::operator+=((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460),
                     in_stack_fffffffffffff458);
      }
      local_494 = 0;
      tVar1 = boost::multiprecision::operator>
                        (in_stack_fffffffffffff448,(int *)in_stack_fffffffffffff440);
    } while (!tVar1);
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::upper(in_stack_fffffffffffff440,(int)((ulong)in_stack_fffffffffffff438 >> 0x20));
    puVar3 = (ulong *)infinity();
    local_4d8 = *puVar3 ^ 0x8000000000000000;
    local_368 = local_4cc;
    local_370 = &local_4d8;
    local_378 = 0;
    local_210 = local_370;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (in_stack_fffffffffffff450,(double)in_stack_fffffffffffff448,in_stack_fffffffffffff440
              );
    tVar1 = boost::multiprecision::operator>=
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffff438,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x41de0e);
    if (tVar1) break;
    local_178 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::upper(in_stack_fffffffffffff440,(int)((ulong)in_stack_fffffffffffff438 >> 0x20));
    local_168 = local_510;
    local_170 = &local_414;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_179,local_170,local_178);
    local_160 = local_510;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff440);
    local_148 = local_510;
    local_150 = local_170;
    local_158 = local_178;
    boost::multiprecision::default_ops::
    eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff440,
               (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff438,
               (cpp_dec_float<50U,_int,_void> *)0x41dedc);
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
    ::operator+=((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460),
                 in_stack_fffffffffffff458);
  }
  return;
}

Assistant:

void SPxMainSM<R>::propagatePseudoobj(SPxLPBase<R>& lp)
{
   R pseudoObj = this->m_objoffset;

   for(int j = lp.nCols() - 1; j >= 0; --j)
   {
      R val = lp.maxObj(j);

      if(val < 0)
      {
         if(lp.lower(j) <= R(-infinity))
            return;

         pseudoObj += val * lp.lower(j);
      }
      else if(val > 0)
      {
         if(lp.upper(j) >= R(-infinity))
            return;

         pseudoObj += val * lp.upper(j);
      }
   }

   if(GT(m_cutoffbound, R(-infinity), this->tolerances()->epsilon())
         && LT(m_cutoffbound, R(infinity), this->tolerances()->epsilon()))
   {
      if(pseudoObj > m_pseudoobj)
         m_pseudoobj = pseudoObj;

      for(int j = lp.nCols() - 1; j >= 0; --j)
      {
         R objval = lp.maxObj(j);

         if(EQ(objval, R(0.0), this->tolerances()->epsilon()))
            continue;

         if(objval < 0.0)
         {
            R newbound = lp.lower(j) + (m_cutoffbound - m_pseudoobj) / objval;

            if(LT(newbound, lp.upper(j), this->tolerances()->epsilon()))
            {
               std::shared_ptr<PostStep> ptr(new TightenBoundsPS(lp, j, lp.upper(j), lp.lower(j),
                                             this->_tolerances));
               m_hist.append(ptr);
               lp.changeUpper(j, newbound);
            }
         }
         else if(objval > 0.0)
         {
            R newbound = lp.upper(j) + (m_cutoffbound - m_pseudoobj) / objval;

            if(GT(newbound, lp.lower(j), this->tolerances()->epsilon()))
            {
               std::shared_ptr<PostStep> ptr(new TightenBoundsPS(lp, j, lp.upper(j), lp.lower(j),
                                             this->_tolerances));
               m_hist.append(ptr);
               lp.changeLower(j, newbound);
            }
         }
      }
   }
}